

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O3

int FeederBig(void)

{
  DWORD DVar1;
  int iVar2;
  int iVar3;
  DWORD DVar4;
  uint uVar5;
  FILE *__stream;
  char *__s;
  char str [9];
  char local_40 [16];
  
  __stream = fopen("in.txt","w");
  if (__stream == (FILE *)0x0) {
    __s = "can\'t create in.txt. No space on disk?";
  }
  else {
    printf("Creating large text... ");
    fflush(_stdout);
    builtin_strncpy(local_40,"abcdabcd",9);
    DVar1 = GetTickCount();
    iVar2 = fputs(local_40,__stream);
    if ((iVar2 != -1) && (iVar2 = fputc(10,__stream), iVar2 != -1)) {
      iVar2 = 0x800000;
      while (iVar3 = fprintf(__stream,"%s",local_40), iVar3 == 8) {
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) {
          fclose(__stream);
          DVar4 = GetTickCount();
          uVar5 = RoundUptoThousand(DVar4 - DVar1);
          printf("done in T=%u seconds. Starting exe with timeout 6*T... ",(ulong)uVar5 / 1000);
          LabTimeout = uVar5 * 6;
          fflush(_stdout);
          return 0;
        }
      }
    }
    __s = "can\'t write in in.txt. No space on disk?";
  }
  puts(__s);
  return -1;
}

Assistant:

static int FeederBig(void) {
    FILE *const in = fopen("in.txt", "w");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    printf("Creating large text... ");
    fflush(stdout);
    const char str[] = "abcdabcd";
    DWORD t = GetTickCount();
    if (fputs(str, in) == EOF || fputc('\n', in) == EOF) {
        printf("can't write in in.txt. No space on disk?\n");
        return -1;
    }
    for (int i = 0; i < 1024 * 1024 * 8; ++i) {
        if (fprintf(in, "%s", str) != strlen(str)) {
            printf("can't write in in.txt. No space on disk?\n");
            return -1;
        }
    }
    fclose(in);
    t = RoundUptoThousand(GetTickCount() - t);
    printf("done in T=%u seconds. Starting exe with timeout 6*T... ", (unsigned)(t / 1000));
    LabTimeout = (int)t * 6;
    fflush(stdout);
    return 0;
}